

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::detail::VulkanFunctions::init_vulkan_funcs
          (VulkanFunctions *this,PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr)

{
  bool bVar1;
  PFN_vkEnumerateInstanceExtensionProperties p_Var2;
  PFN_vkEnumerateInstanceLayerProperties p_Var3;
  PFN_vkEnumerateInstanceVersion p_Var4;
  PFN_vkCreateInstance p_Var5;
  bool ret;
  lock_guard<std::mutex> lg;
  PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr_local;
  VulkanFunctions *this_local;
  
  lg._M_device = (mutex_type *)fp_vkGetInstanceProcAddr;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->init_mutex);
  if (lg._M_device == (mutex_type *)0x0) {
    bVar1 = load_vulkan_library(this);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00118eb9;
    }
  }
  else {
    this->ptr_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)lg._M_device;
  }
  p_Var2 = (PFN_vkEnumerateInstanceExtensionProperties)
           (*this->ptr_vkGetInstanceProcAddr)
                     ((VkInstance)0x0,"vkEnumerateInstanceExtensionProperties");
  this->fp_vkEnumerateInstanceExtensionProperties = p_Var2;
  p_Var3 = (PFN_vkEnumerateInstanceLayerProperties)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceLayerProperties");
  this->fp_vkEnumerateInstanceLayerProperties = p_Var3;
  p_Var4 = (PFN_vkEnumerateInstanceVersion)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceVersion");
  this->fp_vkEnumerateInstanceVersion = p_Var4;
  p_Var5 = (PFN_vkCreateInstance)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkCreateInstance");
  this->fp_vkCreateInstance = p_Var5;
  this_local._7_1_ = true;
LAB_00118eb9:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return this_local._7_1_;
}

Assistant:

bool init_vulkan_funcs(PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr = nullptr) {
        std::lock_guard<std::mutex> lg(init_mutex);
        if (fp_vkGetInstanceProcAddr != nullptr) {
            ptr_vkGetInstanceProcAddr = fp_vkGetInstanceProcAddr;
        } else {
            bool ret = load_vulkan_library();
            if (!ret) return false;
        }

        fp_vkEnumerateInstanceExtensionProperties = reinterpret_cast<PFN_vkEnumerateInstanceExtensionProperties>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceExtensionProperties"));
        fp_vkEnumerateInstanceLayerProperties = reinterpret_cast<PFN_vkEnumerateInstanceLayerProperties>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceLayerProperties"));
        fp_vkEnumerateInstanceVersion = reinterpret_cast<PFN_vkEnumerateInstanceVersion>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceVersion"));
        fp_vkCreateInstance =
            reinterpret_cast<PFN_vkCreateInstance>(ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkCreateInstance"));
        return true;
    }